

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_number_double(parser *this,token *t)

{
  bool bVar1;
  string *psVar2;
  long *plVar3;
  json *this_00;
  json_parser_exception *this_01;
  size_t byte_index;
  token *in_RDX;
  double local_1a8;
  double d;
  istringstream is;
  token *t_local;
  parser *this_local;
  
  psVar2 = token::get_raw_value_abi_cxx11_(in_RDX);
  std::__cxx11::istringstream::istringstream((istringstream *)&d,psVar2,8);
  plVar3 = (long *)std::istream::operator>>((istringstream *)&d,&local_1a8);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1) && (bVar1 = std::isfinite(local_1a8), bVar1)) {
    this_00 = (json *)operator_new(0x58);
    json::json(this_00,local_1a8);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)this,this_00);
    std::__cxx11::istringstream::~istringstream((istringstream *)&d);
    return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
           (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
  }
  this_01 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  psVar2 = token::get_raw_value_abi_cxx11_(in_RDX);
  byte_index = reader::get_byte_index((reader *)t->_vptr_token);
  json_parser_exception::json_parser_exception(this_01,number_out_of_range_e,psVar2,byte_index);
  __cxa_throw(this_01,&json_parser_exception::typeinfo,json_parser_exception::~json_parser_exception
             );
}

Assistant:

unique_ptr<json> parser::parse_number_double(const token &t)
{
    istringstream is(t.get_raw_value());
    double d;

    if (is >> d && isfinite(d))
    {
        return unique_ptr<json>(new json(d));
    }
    else
    {
        // We know the float is syntactically correct so this has to be a range error.
        throw json_parser_exception(
                            json_parser_exception::number_out_of_range_e,
                            t.get_raw_value(),
                            m_reader.get_byte_index());
    }
}